

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::GetInlineeCodeGenRuntimeData(FunctionBody *this,ProfileId profiledCallSiteId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionCodeGenRuntimeData **ppFVar4;
  nullptr_t local_30;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_28;
  Type *local_20;
  Type *codeGenRuntimeData;
  FunctionBody *pFStack_10;
  ProfileId profiledCallSiteId_local;
  FunctionBody *this_local;
  
  codeGenRuntimeData._6_2_ = profiledCallSiteId;
  pFStack_10 = this;
  if (this->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1a32,"(profiledCallSiteId < profiledCallSiteCount)",
                                "profiledCallSiteId < profiledCallSiteCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_20 = GetCodeGenRuntimeDataWithLock(this);
  if (local_20 == (Type *)0x0) {
    local_30 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr(&local_28,&local_30);
  }
  else {
    Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
              (&local_28,local_20 + codeGenRuntimeData._6_2_);
  }
  ppFVar4 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                      ((WriteBarrierPtr *)&local_28);
  return *ppFVar4;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionBody::GetInlineeCodeGenRuntimeData(const ProfileId profiledCallSiteId) const
    {
        Assert(profiledCallSiteId < profiledCallSiteCount);

        auto codeGenRuntimeData = this->GetCodeGenRuntimeDataWithLock();
        return codeGenRuntimeData ? codeGenRuntimeData[profiledCallSiteId] : nullptr;
    }